

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void __thiscall
ON_3dmAnnotationContext::SetManagedDimStyle
          (ON_3dmAnnotationContext *this,ON_DimStyle *parent_dim_style,
          ON_DimStyle *override_dim_style,int V5_3dm_archive_index)

{
  bool bVar1;
  ON_UUID *a;
  ON_UUID *b;
  ON_DimStyle *this_00;
  ON_DimStyle *this_01;
  
  if (override_dim_style != (ON_DimStyle *)0x0) {
    bVar1 = ON_ModelComponent::IdIsNil(&parent_dim_style->super_ON_ModelComponent);
    if (!bVar1) {
      a = ON_ModelComponent::ParentId(&override_dim_style->super_ON_ModelComponent);
      b = ON_ModelComponent::Id(&parent_dim_style->super_ON_ModelComponent);
      bVar1 = ::operator!=(a,b);
      if (!bVar1) {
        bVar1 = ON_DimStyle::HasOverrides(override_dim_style);
        if (bVar1) goto LAB_003ae74b;
      }
    }
  }
  override_dim_style = (ON_DimStyle *)0x0;
LAB_003ae74b:
  this_00 = (ON_DimStyle *)operator_new(0x450);
  ON_DimStyle::ON_DimStyle(this_00,parent_dim_style);
  if (override_dim_style == (ON_DimStyle *)0x0) {
    this_01 = (ON_DimStyle *)0x0;
  }
  else {
    this_01 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle::ON_DimStyle(this_01,override_dim_style);
  }
  if (this->m_managed_parent_dim_style != (ON_DimStyle *)0x0) {
    (*(this->m_managed_parent_dim_style->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4]
    )();
    this->m_managed_parent_dim_style = (ON_DimStyle *)0x0;
  }
  if (this->m_managed_override_dim_style != (ON_DimStyle *)0x0) {
    (*(this->m_managed_override_dim_style->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object
      [4])();
    this->m_managed_override_dim_style = (ON_DimStyle *)0x0;
  }
  this->m_parent_dim_style = (ON_DimStyle *)0x0;
  this->m_override_dim_style = (ON_DimStyle *)0x0;
  this->m_V5_3dm_archive_dim_style_index = -0x7fffffff;
  this->m_managed_parent_dim_style = this_00;
  this->m_managed_override_dim_style = this_01;
  return;
}

Assistant:

void ON_3dmAnnotationContext::SetManagedDimStyle(
  const ON_DimStyle& parent_dim_style,
  const ON_DimStyle* override_dim_style,
  int V5_3dm_archive_index
)
{
  if (nullptr != override_dim_style)
  {
    if (parent_dim_style.IdIsNil() || override_dim_style->ParentId() != parent_dim_style.Id() || false == override_dim_style->HasOverrides())
      override_dim_style = nullptr;
  }

  ON_DimStyle* managed_parent = new ON_DimStyle(parent_dim_style);
  ON_DimStyle* managed_override 
    = (nullptr == override_dim_style)
    ? nullptr
    : new ON_DimStyle(*override_dim_style);

  SetReferencedDimStyle(nullptr,nullptr,ON_UNSET_INT_INDEX);

  m_managed_parent_dim_style = managed_parent;
  m_managed_override_dim_style = managed_override;
}